

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubD::DeleteMarkedComponents
          (ON_SubD *this,bool bDeleteMarkedComponents,ON__UINT8 mark_bits,bool bMarkDeletedFaceEdges
          )

{
  bool bVar1;
  uint uVar2;
  ON_SubDComponentPtr *cptr_list_00;
  undefined1 local_30 [8];
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  bool bMarkDeletedFaceEdges_local;
  ON__UINT8 mark_bits_local;
  bool bDeleteMarkedComponents_local;
  ON_SubD *this_local;
  
  cptr_list.m_capacity._1_1_ = bMarkDeletedFaceEdges;
  cptr_list.m_capacity._2_1_ = mark_bits;
  cptr_list.m_capacity._3_1_ = bDeleteMarkedComponents;
  ON_SimpleArray<ON_SubDComponentPtr>::ON_SimpleArray
            ((ON_SimpleArray<ON_SubDComponentPtr> *)local_30);
  GetMarkedComponents(this,(bool)(cptr_list.m_capacity._3_1_ & 1),cptr_list.m_capacity._2_1_,true,
                      true,true,(ON_SimpleArray<ON_SubDComponentPtr> *)local_30);
  cptr_list_00 = ON_SimpleArray<ON_SubDComponentPtr>::Array
                           ((ON_SimpleArray<ON_SubDComponentPtr> *)local_30);
  uVar2 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount
                    ((ON_SimpleArray<ON_SubDComponentPtr> *)local_30);
  bVar1 = DeleteComponents(this,cptr_list_00,(ulong)uVar2,(bool)(cptr_list.m_capacity._1_1_ & 1));
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray
            ((ON_SimpleArray<ON_SubDComponentPtr> *)local_30);
  return bVar1;
}

Assistant:

bool ON_SubD::DeleteMarkedComponents(
  bool bDeleteMarkedComponents,
  ON__UINT8 mark_bits,
  bool bMarkDeletedFaceEdges
)
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  GetMarkedComponents(bDeleteMarkedComponents, mark_bits, true, true, true, cptr_list);
  return DeleteComponents(
    cptr_list.Array(),
    cptr_list.UnsignedCount(),
    bMarkDeletedFaceEdges
  );
}